

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

ndarray __thiscall SpikesConsumer_python::create_numpy_array(SpikesConsumer_python *this)

{
  long *plVar1;
  _func_int **pp_Var2;
  long in_RSI;
  list l;
  object_base local_48;
  object_base local_40;
  object_base local_38;
  object_base local_30;
  object_base local_28;
  int local_1c;
  
  boost::python::detail::list_base::list_base((list_base *)&local_40);
  boost::python::make_tuple<char[9],char[3]>
            ((python *)&local_48,(char (*) [9])"ntrodeid",(char (*) [3])"i4");
  boost::python::list::append<boost::python::tuple>((list *)&local_40,(tuple *)&local_48);
  (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + -1;
  if ((local_48.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  boost::python::make_tuple<char[8],char[3]>
            ((python *)&local_48,(char (*) [8])"cluster",(char (*) [3])"i4");
  boost::python::list::append<boost::python::tuple>((list *)&local_40,(tuple *)&local_48);
  (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + -1;
  if ((local_48.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  boost::python::make_tuple<char[10],char[3]>
            ((python *)&local_48,(char (*) [10])0x36406a,(char (*) [3])"u4");
  boost::python::list::append<boost::python::tuple>((list *)&local_40,(tuple *)&local_48);
  (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + -1;
  if ((local_48.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  boost::python::make_tuple<char[9],char[4],int>
            ((python *)&local_48,(char (*) [9])"waveform",(char (*) [4])"2i2",
             (int *)(in_RSI + 0x408));
  boost::python::list::append<boost::python::tuple>((list *)&local_40,(tuple *)&local_48);
  (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + -1;
  if ((local_48.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_1c = 1;
  boost::python::make_tuple<int>((python *)&local_38,&local_1c);
  (local_40.m_ptr)->ob_refcnt = (local_40.m_ptr)->ob_refcnt + 1;
  local_30.m_ptr = local_40.m_ptr;
  local_28.m_ptr = (PyObject *)boost::python::numpy::dtype::convert((object *)&local_30,false);
  if (local_28.m_ptr == (PyObject *)0x0) {
    boost::python::throw_error_already_set();
  }
  boost::python::numpy::zeros((numpy *)&local_48,(tuple *)&local_38,(dtype *)&local_28);
  (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + 1;
  plVar1 = *(long **)(in_RSI + 0x430);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 == 0) {
    _Py_Dealloc();
  }
  *(PyObject **)(in_RSI + 0x430) = local_48.m_ptr;
  (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + -1;
  if ((local_48.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  (local_28.m_ptr)->ob_refcnt = (local_28.m_ptr)->ob_refcnt + -1;
  if ((local_28.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  (local_30.m_ptr)->ob_refcnt = (local_30.m_ptr)->ob_refcnt + -1;
  if ((local_30.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  (local_38.m_ptr)->ob_refcnt = (local_38.m_ptr)->ob_refcnt + -1;
  if ((local_38.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  pp_Var2 = *(_func_int ***)(in_RSI + 0x430);
  *pp_Var2 = *pp_Var2 + 1;
  (this->super_SpikesConsumer).super_HFSubConsumer.super_HighFreqSub._vptr_HighFreqSub = pp_Var2;
  (local_40.m_ptr)->ob_refcnt = (local_40.m_ptr)->ob_refcnt + -1;
  if ((local_40.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  return (object)(object)this;
}

Assistant:

np::ndarray create_numpy_array(){
        //x = np.zeros(1, dtype='int32, int32, uint32, npint16')
        list l;
        l.append(boost::python::make_tuple("ntrodeid", "i4"));
        l.append(boost::python::make_tuple("cluster", "i4"));
        l.append(boost::python::make_tuple("timestamp", "u4"));
        l.append(boost::python::make_tuple("waveform", "2i2",maxpoints));
        spikearray = np::zeros(boost::python::make_tuple(1), np::dtype(l));
        return spikearray;
    }